

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pss_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *pmVar3;
  size_t sVar4;
  ulong uVar5;
  ulong __n_00;
  long lVar6;
  uchar *input;
  mbedtls_md_context_t md_ctx;
  uchar salt [64];
  mbedtls_md_context_t local_a0;
  mbedtls_mpi *local_88;
  void *local_80;
  uchar local_78 [72];
  
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 1) {
      return -0x4080;
    }
LAB_0011c5dc:
    __n = ctx->len;
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar3 = mbedtls_md_info_from_type(md_alg);
      if (pmVar3 == (mbedtls_md_info_t *)0x0) goto LAB_0011c670;
      bVar1 = mbedtls_md_get_size(pmVar3);
      hashlen = (uint)bVar1;
    }
    pmVar3 = mbedtls_md_info_from_type(ctx->hash_id);
    iVar2 = -0x4080;
    if (pmVar3 != (mbedtls_md_info_t *)0x0) {
      bVar1 = mbedtls_md_get_size(pmVar3);
      __n_00 = (ulong)bVar1;
      if ((uint)bVar1 * 2 + 2 <= __n) {
        memset(sig,0,__n);
        iVar2 = (*f_rng)(p_rng,local_78,__n_00);
        if (iVar2 == 0) {
          local_88 = &ctx->N;
          local_80 = p_rng;
          sVar4 = mbedtls_mpi_bitlen(local_88);
          lVar6 = __n - (uint)bVar1 * 2;
          sig[lVar6 + -2] = '\x01';
          memcpy(sig + lVar6 + -1,local_78,__n_00);
          mbedtls_md_init(&local_a0);
          iVar2 = mbedtls_md_setup(&local_a0,pmVar3,0);
          if ((iVar2 == 0) && (iVar2 = mbedtls_md_starts(&local_a0), iVar2 == 0)) {
            input = sig + __n_00 + lVar6 + -1;
            iVar2 = mbedtls_md_update(&local_a0,input,8);
            if (((iVar2 == 0) &&
                (((iVar2 = mbedtls_md_update(&local_a0,hash,(ulong)hashlen), iVar2 == 0 &&
                  (iVar2 = mbedtls_md_update(&local_a0,local_78,__n_00), iVar2 == 0)) &&
                 (iVar2 = mbedtls_md_finish(&local_a0,input), iVar2 == 0)))) &&
               (uVar5 = (ulong)((sVar4 + 7 & 7) == 0),
               iVar2 = mgf_mask(sig + uVar5,(~__n_00 + __n) - uVar5,input,__n_00,&local_a0),
               iVar2 == 0)) {
              sVar4 = mbedtls_mpi_bitlen(local_88);
              *sig = *sig & (byte)(0xff >> (((char)__n * '\b' + '\x01') - (char)sVar4 & 0x1fU));
              input[__n_00] = 0xbc;
              iVar2 = 0;
              lVar6 = 0;
              do {
                local_78[lVar6] = '\0';
                lVar6 = lVar6 + 1;
              } while (lVar6 != 0x40);
            }
          }
          mbedtls_md_free(&local_a0);
          if (iVar2 == 0) {
            if (mode == 0) {
              iVar2 = mbedtls_rsa_public(ctx,sig,sig);
            }
            else {
              iVar2 = mbedtls_rsa_private(ctx,f_rng,local_80,sig,sig);
            }
          }
        }
        else {
          iVar2 = iVar2 + -0x4480;
        }
      }
    }
  }
  else {
    if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_0011c5dc;
LAB_0011c670:
    iVar2 = -0x4080;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsassa_pss_sign( mbedtls_rsa_context *ctx,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng,
                         int mode,
                         mbedtls_md_type_t md_alg,
                         unsigned int hashlen,
                         const unsigned char *hash,
                         unsigned char *sig )
{
    size_t olen;
    unsigned char *p = sig;
    unsigned char salt[MBEDTLS_MD_MAX_SIZE];
    unsigned int slen, hlen, offset = 0;
    int ret;
    size_t msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = hlen;

    if( olen < hlen + slen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    memset( sig, 0, olen );

    /* Generate salt of length slen */
    if( ( ret = f_rng( p_rng, salt, slen ) ) != 0 )
        return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

    /* Note: EMSA-PSS encoding is over the length of N - 1 bits */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    p += olen - hlen * 2 - 2;
    *p++ = 0x01;
    memcpy( p, salt, slen );
    p += slen;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    /* Generate H = Hash( M' ) */
    if( ( ret = mbedtls_md_starts( &md_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, p, 8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, hash, hashlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, salt, slen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_finish( &md_ctx, p ) ) != 0 )
        goto exit;

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
        offset = 1;

    /* maskedDB: Apply dbMask to DB */
    if( ( ret = mgf_mask( sig + offset, olen - hlen - 1 - offset, p, hlen,
                          &md_ctx ) ) != 0 )
        goto exit;

    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    sig[0] &= 0xFF >> ( olen * 8 - msb );

    p += hlen;
    *p++ = 0xBC;

    mbedtls_zeroize( salt, sizeof( salt ) );

exit:
    mbedtls_md_free( &md_ctx );

    if( ret != 0 )
        return( ret );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, sig, sig )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig ) );
}